

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

vector<RPCResult,_std::allocator<RPCResult>_> * MempoolEntryDescription(void)

{
  long *plVar1;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  long *plVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long lVar3;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  string in_stack_ffffffffffffed98;
  pointer in_stack_ffffffffffffedb8;
  pointer in_stack_ffffffffffffedc0;
  pointer in_stack_ffffffffffffedc8;
  undefined8 in_stack_ffffffffffffedd0;
  pointer in_stack_ffffffffffffedd8;
  pointer pRVar4;
  pointer in_stack_ffffffffffffede0;
  pointer pRVar5;
  pointer in_stack_ffffffffffffede8;
  pointer pRVar6;
  allocator_type local_1209;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11e8;
  allocator_type local_11c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11a8;
  allocator_type local_1189;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1188;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1168;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1148;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1128;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1110;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1098;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1078;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1058;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1038;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1018;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ff8;
  long *local_fd8 [2];
  long local_fc8 [2];
  long *local_fb8 [2];
  long local_fa8 [2];
  long *local_f98 [2];
  long local_f88 [2];
  long *local_f78 [2];
  long local_f68 [2];
  long *local_f58 [2];
  long local_f48 [2];
  long *local_f38 [2];
  long local_f28 [2];
  RPCResult local_f18;
  long *local_e90 [2];
  long local_e80 [2];
  long *local_e70 [2];
  long local_e60 [2];
  long *local_e50 [2];
  long local_e40 [2];
  long *local_e30 [2];
  long local_e20 [2];
  RPCResult local_e10;
  long *local_d88 [2];
  long local_d78 [2];
  long *local_d68 [2];
  long local_d58 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  long *local_d28 [2];
  long local_d18 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  long *local_ce8 [2];
  long local_cd8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  pointer local_c68 [2];
  undefined1 local_c58 [152];
  RPCResult local_bc0;
  RPCResult local_b38;
  RPCResult local_ab0;
  long *local_a28 [2];
  long local_a18 [2];
  long *local_a08 [2];
  long local_9f8 [2];
  long *local_9e8 [2];
  long local_9d8 [2];
  long *local_9c8 [2];
  long local_9b8 [2];
  long *local_9a8 [2];
  long local_998 [2];
  long *local_988 [2];
  long local_978 [2];
  long *local_968 [2];
  long local_958 [2];
  long *local_948 [2];
  long local_938 [2];
  long *local_928 [2];
  long local_918 [2];
  long *local_908 [2];
  long local_8f8 [2];
  long *local_8e8 [2];
  long local_8d8 [2];
  long *local_8c8 [2];
  long local_8b8 [2];
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  long *local_868 [2];
  long local_858 [2];
  long *local_848 [2];
  long local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_808;
  long *local_7e8 [2];
  long local_7d8 [2];
  pointer local_7c8 [2];
  undefined1 local_7b8 [152];
  RPCResult local_720;
  RPCResult local_698;
  RPCResult local_610;
  RPCResult local_588;
  RPCResult local_500;
  RPCResult local_478;
  RPCResult local_3f0;
  RPCResult local_368;
  RPCResult local_2e0;
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  vector<RPCResult,_std::allocator<RPCResult>_> *local_38;
  
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  local_7c8[0] = (pointer)local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"vsize","");
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,
             "virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted."
             ,"");
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffede0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffedd8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            ((RPCResult *)(local_7b8 + 0x10),NUM,in_stack_ffffffffffffed98,description,inner,
             SUB81(local_7c8,0));
  local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"weight","");
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,"transaction weight as defined in BIP 141.","");
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_00._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_720,NUM,in_stack_ffffffffffffed98,description_00,inner_00,SUB81(&local_808,0));
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"time","");
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,
             "local time transaction entered pool in seconds since 1 Jan 1970 GMT","");
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_01._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_698,NUM_TIME,in_stack_ffffffffffffed98,description_01,inner_01,
             SUB81(local_848,0));
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"height","");
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a8,"block height when transaction entered pool","");
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_02._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_610,NUM,in_stack_ffffffffffffed98,description_02,inner_02,SUB81(local_888,0));
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"descendantcount","");
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e8,"number of in-mempool descendant transactions (including this one)"
             ,"");
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_03._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_588,NUM,in_stack_ffffffffffffed98,description_03,inner_03,SUB81(local_8c8,0));
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"descendantsize","");
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_928,
             "virtual transaction size of in-mempool descendants (including this one)","");
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_04._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_500,NUM,in_stack_ffffffffffffed98,description_04,inner_04,SUB81(local_908,0));
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"ancestorcount","");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_968,"number of in-mempool ancestor transactions (including this one)",
             "");
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_05._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_478,NUM,in_stack_ffffffffffffed98,description_05,inner_05,SUB81(local_948,0));
  local_988[0] = local_978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"ancestorsize","");
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a8,
             "virtual transaction size of in-mempool ancestors (including this one)","");
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_06._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_3f0,NUM,in_stack_ffffffffffffed98,description_06,inner_06,SUB81(local_988,0));
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"wtxid","");
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e8,"hash of serialized transaction, including witness data","");
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_07._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_368,STR_HEX,in_stack_ffffffffffffed98,description_07,inner_07,SUB81(local_9c8,0)
            );
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"fees","");
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"");
  local_c68[0] = (pointer)local_c58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"base","");
  std::operator+(&local_c88,"transaction fee, denominated in ",&CURRENCY_UNIT_abi_cxx11_);
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_08._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            ((RPCResult *)(local_c58 + 0x10),STR_AMOUNT,in_stack_ffffffffffffed98,description_08,
             inner_08,SUB81(local_c68,0));
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"modified","");
  std::operator+(&local_cc8,
                 "transaction fee with fee deltas used for mining priority, denominated in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_bc0,STR_AMOUNT,in_stack_ffffffffffffed98,description_09,inner_09,
             SUB81(&local_ca8,0));
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"ancestor","");
  std::operator+(&local_d08,
                 "transaction fees of in-mempool ancestors (including this one) with fee deltas used for mining priority, denominated in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_b38,STR_AMOUNT,in_stack_ffffffffffffed98,description_10,inner_10,
             SUB81(local_ce8,0));
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"descendant","");
  std::operator+(&local_d48,
                 "transaction fees of in-mempool descendants (including this one) with fee deltas used for mining priority, denominated in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_ab0,STR_AMOUNT,in_stack_ffffffffffffed98,description_11,inner_11,
             SUB81(local_d28,0));
  __l._M_len = 4;
  __l._M_array = (iterator)(local_c58 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1110,__l,&local_1189);
  description_12._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_2e0,OBJ,in_stack_ffffffffffffed98,description_12,inner_12,SUB81(local_a08,0));
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d68,"depends","");
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d88,"unconfirmed transactions used as inputs for this transaction","");
  local_e30[0] = local_e20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e30,"transactionid","");
  local_e50[0] = local_e40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e50,"parent transaction id","");
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_e10,STR_HEX,in_stack_ffffffffffffed98,description_13,inner_13,SUB81(local_e30,0)
            );
  __l_00._M_len = 1;
  __l_00._M_array = &local_e10;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_11a8,__l_00,&local_11c9);
  description_14._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_258,ARR,in_stack_ffffffffffffed98,description_14,inner_14,SUB81(local_d68,0));
  local_e70[0] = local_e60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e70,"spentby","");
  local_e90[0] = local_e80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e90,"unconfirmed transactions spending outputs from this transaction",
             "");
  local_f38[0] = local_f28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f38,"transactionid","");
  local_f58[0] = local_f48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,"child transaction id","");
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description_15._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_f18,STR_HEX,in_stack_ffffffffffffed98,description_15,inner_15,SUB81(local_f38,0)
            );
  __l_01._M_len = 1;
  __l_01._M_array = &local_f18;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_11e8,__l_01,&local_1209);
  description_16._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffede0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (&local_1d0,ARR,in_stack_ffffffffffffed98,description_16,inner_16,SUB81(local_e70,0));
  local_f78[0] = local_f68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f78,"bip125-replaceable","");
  local_f98[0] = local_f88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f98,
             "Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"
             ,"");
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  description_17._M_string_length = (size_type)in_stack_ffffffffffffedc0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_148,BOOL,in_stack_ffffffffffffed98,description_17,inner_17,SUB81(local_f78,0));
  local_fb8[0] = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb8,"unbroadcast","");
  local_fd8[0] = local_fc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fd8,
             "Whether this transaction is currently unbroadcast (initial broadcast not yet acknowledged by any peers)"
             ,"");
  description_18.field_2._M_allocated_capacity = 0;
  description_18._M_dataplus._M_p = (pointer)0x0;
  description_18._M_string_length = 0;
  description_18.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar6;
  RPCResult::RPCResult
            (&local_c0,BOOL,in_stack_ffffffffffffed98,description_18,inner_18,SUB81(local_fb8,0));
  __l_02._M_len = 0xe;
  __l_02._M_array = (iterator)(local_7b8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l_02,(allocator_type *)&stack0xffffffffffffedb7);
  lVar3 = 0x770;
  do {
    if ((long *)(local_7b8 + lVar3) != *(long **)((long)local_7c8 + lVar3)) {
      operator_delete(*(long **)((long)local_7c8 + lVar3),*(long *)(local_7b8 + lVar3) + 1);
    }
    if ((long *)((long)local_7d8 + lVar3) != *(long **)((long)local_7e8 + lVar3)) {
      operator_delete(*(long **)((long)local_7e8 + lVar3),*(long *)((long)local_7d8 + lVar3) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar3));
    if ((long *)((long)local_818 + lVar3) != *(long **)((long)local_828 + lVar3)) {
      operator_delete(*(long **)((long)local_828 + lVar3),*(long *)((long)local_818 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedb8);
  if (local_fd8[0] != local_fc8) {
    operator_delete(local_fd8[0],local_fc8[0] + 1);
  }
  if (local_fb8[0] != local_fa8) {
    operator_delete(local_fb8[0],local_fa8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedd8);
  if (local_f98[0] != local_f88) {
    operator_delete(local_f98[0],local_f88[0] + 1);
  }
  if (local_f78[0] != local_f68) {
    operator_delete(local_f78[0],local_f68[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.m_cond._M_dataplus._M_p != &local_f18.m_cond.field_2) {
    operator_delete(local_f18.m_cond._M_dataplus._M_p,
                    local_f18.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.m_description._M_dataplus._M_p != &local_f18.m_description.field_2) {
    operator_delete(local_f18.m_description._M_dataplus._M_p,
                    local_f18.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f18.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.m_key_name._M_dataplus._M_p != &local_f18.m_key_name.field_2) {
    operator_delete(local_f18.m_key_name._M_dataplus._M_p,
                    local_f18.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  if (local_f58[0] != local_f48) {
    operator_delete(local_f58[0],local_f48[0] + 1);
  }
  if (local_f38[0] != local_f28) {
    operator_delete(local_f38[0],local_f28[0] + 1);
  }
  if (local_e90[0] != local_e80) {
    operator_delete(local_e90[0],local_e80[0] + 1);
  }
  if (local_e70[0] != local_e60) {
    operator_delete(local_e70[0],local_e60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e10.m_cond._M_dataplus._M_p != &local_e10.m_cond.field_2) {
    operator_delete(local_e10.m_cond._M_dataplus._M_p,
                    local_e10.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e10.m_description._M_dataplus._M_p != &local_e10.m_description.field_2) {
    operator_delete(local_e10.m_description._M_dataplus._M_p,
                    local_e10.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e10.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e10.m_key_name._M_dataplus._M_p != &local_e10.m_key_name.field_2) {
    operator_delete(local_e10.m_key_name._M_dataplus._M_p,
                    local_e10.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11c8);
  if (local_e50[0] != local_e40) {
    operator_delete(local_e50[0],local_e40[0] + 1);
  }
  if (local_e30[0] != local_e20) {
    operator_delete(local_e30[0],local_e20[0] + 1);
  }
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0],local_d78[0] + 1);
  }
  if (local_d68[0] != local_d58) {
    operator_delete(local_d68[0],local_d58[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1110);
  lVar3 = 0x220;
  do {
    if ((long *)(local_c58 + lVar3) != *(long **)((long)local_c68 + lVar3)) {
      operator_delete(*(long **)((long)local_c68 + lVar3),*(long *)(local_c58 + lVar3) + 1);
    }
    plVar2 = (long *)((long)local_c68 + lVar3 + -0x10);
    plVar1 = *(long **)((long)&local_c88._M_dataplus._M_p + lVar3);
    if (plVar2 != plVar1) {
      operator_delete(plVar1,*plVar2 + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar3));
    plVar1 = *(long **)((long)&local_cc8._M_dataplus._M_p + lVar3);
    if ((long *)(local_cc8.field_2._M_local_buf + lVar3) != plVar1) {
      operator_delete(plVar1,*(long *)(local_cc8.field_2._M_local_buf + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  if (local_d28[0] != local_d18) {
    operator_delete(local_d28[0],local_d18[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
  }
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
  }
  if (local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_ca8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p,local_c88.field_2._M_allocated_capacity + 1);
  }
  if (local_c68[0] != (pointer)local_c58) {
    operator_delete(local_c68[0],local_c58._0_8_ + 1);
  }
  if (local_a28[0] != local_a18) {
    operator_delete(local_a28[0],local_a18[0] + 1);
  }
  if (local_a08[0] != local_9f8) {
    operator_delete(local_a08[0],local_9f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10f8);
  if (local_9e8[0] != local_9d8) {
    operator_delete(local_9e8[0],local_9d8[0] + 1);
  }
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0],local_9b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10d8);
  if (local_9a8[0] != local_998) {
    operator_delete(local_9a8[0],local_998[0] + 1);
  }
  if (local_988[0] != local_978) {
    operator_delete(local_988[0],local_978[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10b8);
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
  }
  if (local_948[0] != local_938) {
    operator_delete(local_948[0],local_938[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1098);
  if (local_928[0] != local_918) {
    operator_delete(local_928[0],local_918[0] + 1);
  }
  if (local_908[0] != local_8f8) {
    operator_delete(local_908[0],local_8f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1078);
  if (local_8e8[0] != local_8d8) {
    operator_delete(local_8e8[0],local_8d8[0] + 1);
  }
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0],local_8b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1058);
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1038);
  if (local_868[0] != local_858) {
    operator_delete(local_868[0],local_858[0] + 1);
  }
  if (local_848[0] != local_838) {
    operator_delete(local_848[0],local_838[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1018);
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
  if (local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_808.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ff8);
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  if (local_7c8[0] != (pointer)local_7b8) {
    operator_delete(local_7c8[0],local_7b8._0_8_ + 1);
  }
  if (*(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> MempoolEntryDescription()
{
    return {
        RPCResult{RPCResult::Type::NUM, "vsize", "virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted."},
        RPCResult{RPCResult::Type::NUM, "weight", "transaction weight as defined in BIP 141."},
        RPCResult{RPCResult::Type::NUM_TIME, "time", "local time transaction entered pool in seconds since 1 Jan 1970 GMT"},
        RPCResult{RPCResult::Type::NUM, "height", "block height when transaction entered pool"},
        RPCResult{RPCResult::Type::NUM, "descendantcount", "number of in-mempool descendant transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "descendantsize", "virtual transaction size of in-mempool descendants (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorcount", "number of in-mempool ancestor transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorsize", "virtual transaction size of in-mempool ancestors (including this one)"},
        RPCResult{RPCResult::Type::STR_HEX, "wtxid", "hash of serialized transaction, including witness data"},
        RPCResult{RPCResult::Type::OBJ, "fees", "",
            {
                RPCResult{RPCResult::Type::STR_AMOUNT, "base", "transaction fee, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "modified", "transaction fee with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "ancestor", "transaction fees of in-mempool ancestors (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "descendant", "transaction fees of in-mempool descendants (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
            }},
        RPCResult{RPCResult::Type::ARR, "depends", "unconfirmed transactions used as inputs for this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "parent transaction id"}}},
        RPCResult{RPCResult::Type::ARR, "spentby", "unconfirmed transactions spending outputs from this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "child transaction id"}}},
        RPCResult{RPCResult::Type::BOOL, "bip125-replaceable", "Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"},
        RPCResult{RPCResult::Type::BOOL, "unbroadcast", "Whether this transaction is currently unbroadcast (initial broadcast not yet acknowledged by any peers)"},
    };
}